

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<std::pair<QByteArray,_QByteArray>_>::clear(QList<std::pair<QByteArray,_QByteArray>_> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QGenericArrayOps<std::pair<QByteArray,_QByteArray>_> *this_00;
  __off_t __length;
  QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  qsizetype alloc;
  QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<std::pair<QByteArray,_QByteArray>_> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::needsDetach(in_RDI);
    if (bVar2) {
      qVar3 = -0x5555555555555556;
      alloc = -0x5555555555555556;
      pQVar4 = (QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)0xaaaaaaaaaaaaaaaa;
      QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::allocatedCapacity(in_RDI);
      QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::QArrayDataPointer
                (pQVar4,alloc,qVar3,option);
      QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::swap(in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QGenericArrayOps<std::pair<QByteArray,_QByteArray>_> *)
                QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::operator->(in_RDI);
      QtPrivate::QGenericArrayOps<std::pair<QByteArray,_QByteArray>_>::truncate
                (this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }